

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O0

unsigned_long __thiscall rlist::listLength(rlist *this)

{
  unsigned_long uVar1;
  rlist *this_local;
  
  this->length = 0;
  if (this->rl->head != (listNode *)0x0) {
    this->view = this->rl->head;
    while (this->view != (listNode *)0x0) {
      this->length = this->length + 1;
      this->view = this->view->next;
    }
  }
  uVar1 = this->length;
  this->rl->len = uVar1;
  return uVar1;
}

Assistant:

unsigned long rlist::listLength(){
    length=0;
    if(rl->head!=NULL){
        view=rl->head;
        while(view!=nullptr){
            length++;
            view=view->next;
        }
    } 
    return rl->len=length;
}